

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

void __thiscall
ON_SimpleArray<ON_UuidIndex>::Append(ON_SimpleArray<ON_UuidIndex> *this,ON_UuidIndex *x)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  int iVar3;
  ON_UuidIndex *pOVar4;
  void *temp;
  ON_UuidIndex *pOStack_20;
  int newcapacity;
  ON_UuidIndex *p;
  ON_UuidIndex *x_local;
  ON_SimpleArray<ON_UuidIndex> *this_local;
  
  pOStack_20 = x;
  if (this->m_count == this->m_capacity) {
    iVar3 = NewCapacity(this);
    if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
      pOStack_20 = (ON_UuidIndex *)onmalloc(0x14);
      uVar1 = (x->m_id).Data2;
      uVar2 = (x->m_id).Data3;
      (pOStack_20->m_id).Data1 = (x->m_id).Data1;
      (pOStack_20->m_id).Data2 = uVar1;
      (pOStack_20->m_id).Data3 = uVar2;
      *(undefined8 *)(pOStack_20->m_id).Data4 = *(undefined8 *)(x->m_id).Data4;
      pOStack_20->m_i = x->m_i;
    }
    Reserve(this,(long)iVar3);
    if (this->m_a == (ON_UuidIndex *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  iVar3 = this->m_count;
  this->m_count = iVar3 + 1;
  pOVar4 = this->m_a + iVar3;
  uVar1 = (pOStack_20->m_id).Data2;
  uVar2 = (pOStack_20->m_id).Data3;
  (pOVar4->m_id).Data1 = (pOStack_20->m_id).Data1;
  (pOVar4->m_id).Data2 = uVar1;
  (pOVar4->m_id).Data3 = uVar2;
  *(undefined8 *)(pOVar4->m_id).Data4 = *(undefined8 *)(pOStack_20->m_id).Data4;
  pOVar4->m_i = pOStack_20->m_i;
  if (pOStack_20 != x) {
    onfree(pOStack_20);
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}